

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VCopyOps(N_Vector w,N_Vector v)

{
  SUNContext sunctx_local_scope_;
  N_Vector v_local;
  N_Vector w_local;
  
  v->ops->nvgetvectorid = w->ops->nvgetvectorid;
  v->ops->nvclone = w->ops->nvclone;
  v->ops->nvcloneempty = w->ops->nvcloneempty;
  v->ops->nvdestroy = w->ops->nvdestroy;
  v->ops->nvspace = w->ops->nvspace;
  v->ops->nvgetarraypointer = w->ops->nvgetarraypointer;
  v->ops->nvgetdevicearraypointer = w->ops->nvgetdevicearraypointer;
  v->ops->nvsetarraypointer = w->ops->nvsetarraypointer;
  v->ops->nvgetcommunicator = w->ops->nvgetcommunicator;
  v->ops->nvgetlength = w->ops->nvgetlength;
  v->ops->nvgetlocallength = w->ops->nvgetlocallength;
  v->ops->nvlinearsum = w->ops->nvlinearsum;
  v->ops->nvconst = w->ops->nvconst;
  v->ops->nvprod = w->ops->nvprod;
  v->ops->nvdiv = w->ops->nvdiv;
  v->ops->nvscale = w->ops->nvscale;
  v->ops->nvabs = w->ops->nvabs;
  v->ops->nvinv = w->ops->nvinv;
  v->ops->nvaddconst = w->ops->nvaddconst;
  v->ops->nvdotprod = w->ops->nvdotprod;
  v->ops->nvmaxnorm = w->ops->nvmaxnorm;
  v->ops->nvwrmsnorm = w->ops->nvwrmsnorm;
  v->ops->nvwrmsnormmask = w->ops->nvwrmsnormmask;
  v->ops->nvmin = w->ops->nvmin;
  v->ops->nvwl2norm = w->ops->nvwl2norm;
  v->ops->nvl1norm = w->ops->nvl1norm;
  v->ops->nvcompare = w->ops->nvcompare;
  v->ops->nvinvtest = w->ops->nvinvtest;
  v->ops->nvconstrmask = w->ops->nvconstrmask;
  v->ops->nvminquotient = w->ops->nvminquotient;
  v->ops->nvlinearcombination = w->ops->nvlinearcombination;
  v->ops->nvscaleaddmulti = w->ops->nvscaleaddmulti;
  v->ops->nvdotprodmulti = w->ops->nvdotprodmulti;
  v->ops->nvlinearsumvectorarray = w->ops->nvlinearsumvectorarray;
  v->ops->nvscalevectorarray = w->ops->nvscalevectorarray;
  v->ops->nvconstvectorarray = w->ops->nvconstvectorarray;
  v->ops->nvwrmsnormvectorarray = w->ops->nvwrmsnormvectorarray;
  v->ops->nvwrmsnormmaskvectorarray = w->ops->nvwrmsnormmaskvectorarray;
  v->ops->nvscaleaddmultivectorarray = w->ops->nvscaleaddmultivectorarray;
  v->ops->nvlinearcombinationvectorarray = w->ops->nvlinearcombinationvectorarray;
  v->ops->nvdotprodlocal = w->ops->nvdotprodlocal;
  v->ops->nvmaxnormlocal = w->ops->nvmaxnormlocal;
  v->ops->nvminlocal = w->ops->nvminlocal;
  v->ops->nvl1normlocal = w->ops->nvl1normlocal;
  v->ops->nvinvtestlocal = w->ops->nvinvtestlocal;
  v->ops->nvconstrmasklocal = w->ops->nvconstrmasklocal;
  v->ops->nvminquotientlocal = w->ops->nvminquotientlocal;
  v->ops->nvwsqrsumlocal = w->ops->nvwsqrsumlocal;
  v->ops->nvwsqrsummasklocal = w->ops->nvwsqrsummasklocal;
  v->ops->nvdotprodmultilocal = w->ops->nvdotprodmultilocal;
  v->ops->nvdotprodmultiallreduce = w->ops->nvdotprodmultiallreduce;
  v->ops->nvbufsize = w->ops->nvbufsize;
  v->ops->nvbufpack = w->ops->nvbufpack;
  v->ops->nvbufunpack = w->ops->nvbufunpack;
  v->ops->nvprint = w->ops->nvprint;
  v->ops->nvprintfile = w->ops->nvprintfile;
  return 0;
}

Assistant:

SUNErrCode N_VCopyOps(N_Vector w, N_Vector v)
{
  SUNFunctionBegin(w->sunctx);
  /* Check that ops structures exist */
  SUNAssert(w && w->ops && v && v->ops, SUN_ERR_ARG_CORRUPT);

  /* Copy ops from w to v */

  /*
   * REQUIRED operations.
   *
   * These must be implemented by derivations of the generic N_Vector.
   */

  /* constructors, destructors, and utility operations */
  v->ops->nvgetvectorid           = w->ops->nvgetvectorid;
  v->ops->nvclone                 = w->ops->nvclone;
  v->ops->nvcloneempty            = w->ops->nvcloneempty;
  v->ops->nvdestroy               = w->ops->nvdestroy;
  v->ops->nvspace                 = w->ops->nvspace;
  v->ops->nvgetarraypointer       = w->ops->nvgetarraypointer;
  v->ops->nvgetdevicearraypointer = w->ops->nvgetdevicearraypointer;
  v->ops->nvsetarraypointer       = w->ops->nvsetarraypointer;
  v->ops->nvgetcommunicator       = w->ops->nvgetcommunicator;
  v->ops->nvgetlength             = w->ops->nvgetlength;
  v->ops->nvgetlocallength        = w->ops->nvgetlocallength;

  /* standard vector operations */
  v->ops->nvlinearsum    = w->ops->nvlinearsum;
  v->ops->nvconst        = w->ops->nvconst;
  v->ops->nvprod         = w->ops->nvprod;
  v->ops->nvdiv          = w->ops->nvdiv;
  v->ops->nvscale        = w->ops->nvscale;
  v->ops->nvabs          = w->ops->nvabs;
  v->ops->nvinv          = w->ops->nvinv;
  v->ops->nvaddconst     = w->ops->nvaddconst;
  v->ops->nvdotprod      = w->ops->nvdotprod;
  v->ops->nvmaxnorm      = w->ops->nvmaxnorm;
  v->ops->nvwrmsnorm     = w->ops->nvwrmsnorm;
  v->ops->nvwrmsnormmask = w->ops->nvwrmsnormmask;
  v->ops->nvmin          = w->ops->nvmin;
  v->ops->nvwl2norm      = w->ops->nvwl2norm;
  v->ops->nvl1norm       = w->ops->nvl1norm;
  v->ops->nvcompare      = w->ops->nvcompare;
  v->ops->nvinvtest      = w->ops->nvinvtest;
  v->ops->nvconstrmask   = w->ops->nvconstrmask;
  v->ops->nvminquotient  = w->ops->nvminquotient;

  /*
   * OPTIONAL operations.
   *
   * These operations provide default implementations that may be overriden.
   */

  /* fused vector operations */
  v->ops->nvlinearcombination = w->ops->nvlinearcombination;
  v->ops->nvscaleaddmulti     = w->ops->nvscaleaddmulti;
  v->ops->nvdotprodmulti      = w->ops->nvdotprodmulti;

  /* vector array operations */
  v->ops->nvlinearsumvectorarray     = w->ops->nvlinearsumvectorarray;
  v->ops->nvscalevectorarray         = w->ops->nvscalevectorarray;
  v->ops->nvconstvectorarray         = w->ops->nvconstvectorarray;
  v->ops->nvwrmsnormvectorarray      = w->ops->nvwrmsnormvectorarray;
  v->ops->nvwrmsnormmaskvectorarray  = w->ops->nvwrmsnormmaskvectorarray;
  v->ops->nvscaleaddmultivectorarray = w->ops->nvscaleaddmultivectorarray;
  v->ops->nvlinearcombinationvectorarray = w->ops->nvlinearcombinationvectorarray;

  /*
   * OPTIONAL operations with no default implementation.
   */

  /* local reduction operations */
  v->ops->nvdotprodlocal     = w->ops->nvdotprodlocal;
  v->ops->nvmaxnormlocal     = w->ops->nvmaxnormlocal;
  v->ops->nvminlocal         = w->ops->nvminlocal;
  v->ops->nvl1normlocal      = w->ops->nvl1normlocal;
  v->ops->nvinvtestlocal     = w->ops->nvinvtestlocal;
  v->ops->nvconstrmasklocal  = w->ops->nvconstrmasklocal;
  v->ops->nvminquotientlocal = w->ops->nvminquotientlocal;
  v->ops->nvwsqrsumlocal     = w->ops->nvwsqrsumlocal;
  v->ops->nvwsqrsummasklocal = w->ops->nvwsqrsummasklocal;

  /* single buffer reduction operations */
  v->ops->nvdotprodmultilocal     = w->ops->nvdotprodmultilocal;
  v->ops->nvdotprodmultiallreduce = w->ops->nvdotprodmultiallreduce;

  /* XBraid interface operations */
  v->ops->nvbufsize   = w->ops->nvbufsize;
  v->ops->nvbufpack   = w->ops->nvbufpack;
  v->ops->nvbufunpack = w->ops->nvbufunpack;

  /* debugging functions  */
  v->ops->nvprint     = w->ops->nvprint;
  v->ops->nvprintfile = w->ops->nvprintfile;

  return SUN_SUCCESS;
}